

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::BasicWriter<wchar_t>::write_double<long_double>
          (BasicWriter<wchar_t> *this,longdouble value,FormatSpec *spec)

{
  void *__src;
  long lVar1;
  Alignment AVar2;
  wchar_t wVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  wchar_t wVar8;
  CharPtr pwVar9;
  undefined8 *puVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  byte bVar15;
  wchar_t __tmp;
  char *pcVar16;
  char *pcVar17;
  long lVar18;
  int in_R9D;
  long lVar19;
  byte bVar20;
  CharTraits<wchar_t> *this_00;
  ulong uVar21;
  bool bVar22;
  int iVar25;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar29;
  undefined1 auVar28 [16];
  wchar_t format [10];
  char in_stack_ffffffffffffff4f;
  undefined2 in_stack_ffffffffffffff50;
  undefined6 in_stack_ffffffffffffff52;
  uint local_9c;
  long local_78;
  ushort uStack_70;
  undefined4 local_58;
  undefined1 local_54 [8];
  undefined4 auStack_4c [7];
  
  bVar20 = spec->type_;
  uVar11 = bVar20 - 0x41;
  if (uVar11 < 0x27) {
    if ((0x71UL >> ((ulong)uVar11 & 0x3f) & 1) == 0) {
      if ((0x7100000000U >> ((ulong)uVar11 & 0x3f) & 1) == 0) goto LAB_0015badf;
      goto LAB_0015b54b;
    }
    bVar22 = true;
  }
  else {
LAB_0015badf:
    if (bVar20 != 0) {
      internal::report_unknown_type
                (in_stack_ffffffffffffff4f,
                 (char *)CONCAT62(in_stack_ffffffffffffff52,in_stack_ffffffffffffff50));
    }
    bVar20 = 0x67;
LAB_0015b54b:
    bVar22 = false;
  }
  if (0.0 <= (double)value) {
    if ((spec->flags_ & 1) == 0) {
      bVar15 = 0;
    }
    else {
      bVar15 = 0x2b;
      if ((spec->flags_ & 2) == 0) {
        bVar15 = 0x20;
      }
    }
  }
  else {
    value = -value;
    bVar15 = 0x2d;
  }
  if (NAN(value)) {
    pcVar17 = " nan";
    if (bVar22) {
      pcVar17 = " NAN";
    }
    pcVar16 = " nan";
    if (bVar22) {
      pcVar16 = " NAN";
    }
    pcVar16 = pcVar16 + 1;
    if (bVar15 != 0) {
      pcVar16 = pcVar17;
    }
    uVar12 = (ulong)(bVar15 != 0);
LAB_0015b5eb:
    pwVar9 = write_str<char>(this,pcVar16,uVar12 + 3,&spec->super_AlignSpec);
    if (bVar15 != 0) {
      *pwVar9 = (uint)bVar15;
    }
    return;
  }
  local_78 = SUB108(value,0);
  uStack_70 = (ushort)((unkuint10)value >> 0x40);
  if ((~uStack_70 & 0x7fff) == 0 && local_78 == -0x8000000000000000) {
    pcVar17 = " inf";
    if (bVar22) {
      pcVar17 = " INF";
    }
    pcVar16 = " inf";
    if (bVar22) {
      pcVar16 = " INF";
    }
    uVar12 = (ulong)(bVar15 != 0);
    pcVar16 = pcVar16 + 1;
    if (bVar15 != 0) {
      pcVar16 = pcVar17;
    }
    goto LAB_0015b5eb;
  }
  puVar10 = *(undefined8 **)(this + 8);
  lVar19 = puVar10[2];
  uVar11 = (spec->super_AlignSpec).super_WidthSpec.width_;
  if (bVar15 != 0) {
    if ((ulong)puVar10[3] < (ulong)(uVar11 + (uVar11 == 0)) + lVar19) {
      (**(code **)*puVar10)();
    }
    bVar22 = uVar11 == 0;
    uVar11 = uVar11 - 1;
    if (bVar22) {
      uVar11 = 0;
    }
    lVar19 = lVar19 + 1;
  }
  local_58 = 0x25;
  if ((spec->flags_ & 8) == 0) {
    puVar10 = (undefined8 *)local_54;
  }
  else {
    puVar10 = (undefined8 *)(local_54 + 4);
    local_54._0_4_ = 0x23;
  }
  AVar2 = (spec->super_AlignSpec).align_;
  if (AVar2 == ALIGN_CENTER) {
LAB_0015b6a9:
    uVar11 = 0;
  }
  else {
    if (AVar2 == ALIGN_LEFT) {
      *(undefined4 *)puVar10 = 0x2d;
      puVar10 = (undefined8 *)((long)puVar10 + 4);
    }
    if (uVar11 == 0) goto LAB_0015b6a9;
    *(undefined4 *)puVar10 = 0x2a;
    puVar10 = (undefined8 *)((long)puVar10 + 4);
  }
  if (-1 < spec->precision_) {
    *puVar10 = 0x2a0000002e;
    puVar10 = puVar10 + 1;
  }
  *(undefined4 *)puVar10 = 0x4c;
  *(int *)((long)puVar10 + 4) = (int)(char)bVar20;
  *(undefined4 *)(puVar10 + 1) = 0;
  wVar3 = (spec->super_AlignSpec).super_WidthSpec.fill_;
  local_9c = 0;
  do {
    this_00 = (CharTraits<wchar_t> *)(*(long *)(*(long *)(this + 8) + 8) + lVar19 * 4);
    uVar7 = internal::CharTraits<wchar_t>::format_float<long_double>
                      (this_00,(wchar_t *)(*(long *)(*(long *)(this + 8) + 0x18) - lVar19),
                       (size_t)&local_58,(wchar_t *)(ulong)uVar11,spec->precision_,in_R9D,value);
    if ((int)uVar7 < 0) {
      puVar10 = *(undefined8 **)(this + 8);
      bVar22 = true;
      if (puVar10[3] != -1) {
        (**(code **)*puVar10)(puVar10,puVar10[3] + 1);
      }
    }
    else {
      uVar12 = (*(undefined8 **)(this + 8))[3];
      local_9c = uVar7;
      if ((ulong)uVar7 + lVar19 < uVar12) {
        bVar22 = false;
      }
      else {
        bVar22 = true;
        if (uVar12 < (ulong)uVar7 + lVar19 + 1) {
          (**(code **)**(undefined8 **)(this + 8))();
        }
      }
    }
  } while (bVar22);
  if (bVar15 == 0) {
    bVar15 = 0;
    goto LAB_0015b7fe;
  }
  AVar2 = (spec->super_AlignSpec).align_;
  if (AVar2 == ALIGN_RIGHT) {
    iVar25 = *(int *)this_00;
joined_r0x0015b7ec:
    wVar8 = wVar3;
    if (iVar25 != 0x20) goto LAB_0015b7f2;
  }
  else {
    if (AVar2 == ALIGN_DEFAULT) {
      iVar25 = *(int *)this_00;
      goto joined_r0x0015b7ec;
    }
LAB_0015b7f2:
    wVar8 = (wchar_t)bVar15;
    bVar15 = 0;
  }
  *(wchar_t *)(this_00 + -4) = wVar8;
  local_9c = local_9c + 1;
LAB_0015b7fe:
  if ((spec->super_AlignSpec).align_ == ALIGN_CENTER) {
    uVar11 = (spec->super_AlignSpec).super_WidthSpec.width_;
    if (local_9c < uVar11) {
      puVar10 = *(undefined8 **)(this + 8);
      lVar19 = puVar10[2];
      uVar12 = lVar19 + (ulong)uVar11;
      if ((ulong)puVar10[3] < uVar12) {
        (**(code **)*puVar10)(puVar10,uVar12);
      }
      puVar10[2] = uVar12;
      lVar13 = *(long *)(*(long *)(this + 8) + 8);
      __src = (void *)(lVar13 + lVar19 * 4);
      uVar21 = (ulong)local_9c;
      memmove((void *)((long)__src + (ulong)(uVar11 - local_9c >> 1) * 4),__src,uVar21 * 4);
      auVar6 = _DAT_00168ad0;
      auVar5 = _DAT_00164510;
      auVar4 = _DAT_00164500;
      uVar11 = (spec->super_AlignSpec).super_WidthSpec.width_;
      uVar14 = uVar11 - uVar21;
      uVar12 = uVar14 >> 1;
      if (1 < uVar14) {
        uVar14 = uVar12 + 0x3fffffffffffffff & 0x3fffffffffffffff;
        auVar23._8_4_ = (int)uVar14;
        auVar23._0_8_ = uVar14;
        auVar23._12_4_ = (int)(uVar14 >> 0x20);
        lVar1 = lVar13 + lVar19 * 4;
        lVar18 = 0;
        auVar23 = auVar23 ^ _DAT_00164510;
        do {
          auVar26._8_4_ = (int)lVar18;
          auVar26._0_8_ = lVar18;
          auVar26._12_4_ = (int)((ulong)lVar18 >> 0x20);
          auVar28 = (auVar26 | auVar4) ^ auVar5;
          iVar25 = auVar23._4_4_;
          if ((bool)(~(auVar28._4_4_ == iVar25 && auVar23._0_4_ < auVar28._0_4_ ||
                      iVar25 < auVar28._4_4_) & 1)) {
            *(wchar_t *)(lVar1 + lVar18 * 4) = wVar3;
          }
          if ((auVar28._12_4_ != auVar23._12_4_ || auVar28._8_4_ <= auVar23._8_4_) &&
              auVar28._12_4_ <= auVar23._12_4_) {
            *(wchar_t *)(lVar1 + 4 + lVar18 * 4) = wVar3;
          }
          auVar26 = (auVar26 | auVar6) ^ auVar5;
          iVar29 = auVar26._4_4_;
          if (iVar29 <= iVar25 && (iVar29 != iVar25 || auVar26._0_4_ <= auVar23._0_4_)) {
            *(wchar_t *)(lVar1 + 8 + lVar18 * 4) = wVar3;
            *(wchar_t *)(lVar1 + 0xc + lVar18 * 4) = wVar3;
          }
          lVar18 = lVar18 + 4;
        } while ((uVar14 - ((uint)(uVar12 + 0x3fffffffffffffff) & 3)) + 4 != lVar18);
      }
      auVar6 = _DAT_00168ad0;
      auVar5 = _DAT_00164510;
      auVar4 = _DAT_00164500;
      if (uVar11 == local_9c) {
        return;
      }
      uVar14 = ((ulong)uVar11 * 4 + (uVar12 + uVar21) * -4) - 4;
      auVar28._8_4_ = (int)uVar14;
      auVar28._0_8_ = uVar14;
      auVar28._12_4_ = (int)(uVar14 >> 0x20);
      auVar24._0_8_ = uVar14 >> 2;
      auVar24._8_8_ = auVar28._8_8_ >> 2;
      lVar13 = uVar12 * 4 + lVar19 * 4 + uVar21 * 4 + lVar13;
      uVar12 = 0;
      auVar24 = auVar24 ^ _DAT_00164510;
      do {
        auVar27._8_4_ = (int)uVar12;
        auVar27._0_8_ = uVar12;
        auVar27._12_4_ = (int)(uVar12 >> 0x20);
        auVar23 = (auVar27 | auVar4) ^ auVar5;
        iVar25 = auVar24._4_4_;
        if ((bool)(~(auVar23._4_4_ == iVar25 && auVar24._0_4_ < auVar23._0_4_ ||
                    iVar25 < auVar23._4_4_) & 1)) {
          *(wchar_t *)(lVar13 + uVar12 * 4) = wVar3;
        }
        if ((auVar23._12_4_ != auVar24._12_4_ || auVar23._8_4_ <= auVar24._8_4_) &&
            auVar23._12_4_ <= auVar24._12_4_) {
          *(wchar_t *)(lVar13 + 4 + uVar12 * 4) = wVar3;
        }
        auVar23 = (auVar27 | auVar6) ^ auVar5;
        iVar29 = auVar23._4_4_;
        if (iVar29 <= iVar25 && (iVar29 != iVar25 || auVar23._0_4_ <= auVar24._0_4_)) {
          *(wchar_t *)(lVar13 + 8 + uVar12 * 4) = wVar3;
          *(wchar_t *)(lVar13 + 0xc + uVar12 * 4) = wVar3;
        }
        uVar12 = uVar12 + 4;
      } while (((uVar14 >> 2) + 4 & 0xfffffffffffffffc) != uVar12);
      return;
    }
  }
  if ((bVar15 != 0) || ((spec->super_AlignSpec).super_WidthSpec.fill_ != L' ')) {
    wVar8 = *(wchar_t *)this_00;
    while (wVar8 == L' ') {
      *(wchar_t *)this_00 = wVar3;
      wVar8 = *(wchar_t *)(this_00 + 4);
      this_00 = this_00 + 4;
    }
    if (bVar15 != 0) {
      *(uint *)(this_00 + -4) = (uint)bVar15;
    }
  }
  puVar10 = *(undefined8 **)(this + 8);
  uVar12 = (ulong)local_9c + puVar10[2];
  if ((ulong)puVar10[3] < uVar12) {
    (**(code **)*puVar10)(puVar10,uVar12);
  }
  puVar10[2] = uVar12;
  return;
}

Assistant:

void BasicWriter<Char>::write_double(T value, const FormatSpec &spec) {
  // Check type.
  char type = spec.type();
  bool upper = false;
  switch (type) {
  case 0:
    type = 'g';
    break;
  case 'e': case 'f': case 'g': case 'a':
    break;
  case 'F':
#if FMT_MSC_VER
    // MSVC's printf doesn't support 'F'.
    type = 'f';
#endif
    // Fall through.
  case 'E': case 'G': case 'A':
    upper = true;
    break;
  default:
    internal::report_unknown_type(type, "double");
    break;
  }

  char sign = 0;
  // Use isnegative instead of value < 0 because the latter is always
  // false for NaN.
  if (internal::FPUtil::isnegative(static_cast<double>(value))) {
    sign = '-';
    value = -value;
  } else if (spec.flag(SIGN_FLAG)) {
    sign = spec.flag(PLUS_FLAG) ? '+' : ' ';
  }

  if (internal::FPUtil::isnotanumber(value)) {
    // Format NaN ourselves because sprintf's output is not consistent
    // across platforms.
    std::size_t nan_size = 4;
    const char *nan = upper ? " NAN" : " nan";
    if (!sign) {
      --nan_size;
      ++nan;
    }
    CharPtr out = write_str(nan, nan_size, spec);
    if (sign)
      *out = sign;
    return;
  }

  if (internal::FPUtil::isinfinity(value)) {
    // Format infinity ourselves because sprintf's output is not consistent
    // across platforms.
    std::size_t inf_size = 4;
    const char *inf = upper ? " INF" : " inf";
    if (!sign) {
      --inf_size;
      ++inf;
    }
    CharPtr out = write_str(inf, inf_size, spec);
    if (sign)
      *out = sign;
    return;
  }

  std::size_t offset = buffer_.size();
  unsigned width = spec.width();
  if (sign) {
    buffer_.reserve(buffer_.size() + (width > 1u ? width : 1u));
    if (width > 0)
      --width;
    ++offset;
  }

  // Build format string.
  enum { MAX_FORMAT_SIZE = 10}; // longest format: %#-*.*Lg
  Char format[MAX_FORMAT_SIZE];
  Char *format_ptr = format;
  *format_ptr++ = '%';
  unsigned width_for_sprintf = width;
  if (spec.flag(HASH_FLAG))
    *format_ptr++ = '#';
  if (spec.align() == ALIGN_CENTER) {
    width_for_sprintf = 0;
  } else {
    if (spec.align() == ALIGN_LEFT)
      *format_ptr++ = '-';
    if (width != 0)
      *format_ptr++ = '*';
  }
  if (spec.precision() >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }

  append_float_length(format_ptr, value);
  *format_ptr++ = type;
  *format_ptr = '\0';

  // Format using snprintf.
  Char fill = internal::CharTraits<Char>::cast(spec.fill());
  unsigned n = 0;
  Char *start = 0;
  for (;;) {
    std::size_t buffer_size = buffer_.capacity() - offset;
#if FMT_MSC_VER
    // MSVC's vsnprintf_s doesn't work with zero size, so reserve
    // space for at least one extra character to make the size non-zero.
    // Note that the buffer's capacity will increase by more than 1.
    if (buffer_size == 0) {
      buffer_.reserve(offset + 1);
      buffer_size = buffer_.capacity() - offset;
    }
#endif
    start = &buffer_[offset];
    int result = internal::CharTraits<Char>::format_float(
        start, buffer_size, format, width_for_sprintf, spec.precision(), value);
    if (result >= 0) {
      n = internal::to_unsigned(result);
      if (offset + n < buffer_.capacity())
        break;  // The buffer is large enough - continue with formatting.
      buffer_.reserve(offset + n + 1);
    } else {
      // If result is negative we ask to increase the capacity by at least 1,
      // but as std::vector, the buffer grows exponentially.
      buffer_.reserve(buffer_.capacity() + 1);
    }
  }
  if (sign) {
    if ((spec.align() != ALIGN_RIGHT && spec.align() != ALIGN_DEFAULT) ||
        *start != ' ') {
      *(start - 1) = sign;
      sign = 0;
    } else {
      *(start - 1) = fill;
    }
    ++n;
  }
  if (spec.align() == ALIGN_CENTER && spec.width() > n) {
    width = spec.width();
    CharPtr p = grow_buffer(width);
    std::memmove(get(p) + (width - n) / 2, get(p), n * sizeof(Char));
    fill_padding(p, spec.width(), n, fill);
    return;
  }
  if (spec.fill() != ' ' || sign) {
    while (*start == ' ')
      *start++ = fill;
    if (sign)
      *(start - 1) = sign;
  }
  grow_buffer(n);
}